

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::setWeekNumbersShown(QCalendarModel *this,bool show)

{
  long lVar1;
  code cVar2;
  byte in_SIL;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  undefined1 local_20 [8];
  QCalendarModel *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = (code)(in_SIL & 1);
  if ((code)((byte)in_RDI[0x48] & 1) != cVar2) {
    in_RDI[0x48] = cVar2;
    if (cVar2 == (code)0x0) {
      QModelIndex::QModelIndex((QModelIndex *)0x519f26);
      QAbstractItemModel::beginRemoveColumns(in_RDI,(int)local_38,0);
      *(undefined4 *)(in_RDI + 0x10) = 0;
      QAbstractItemModel::endRemoveColumns();
    }
    else {
      QModelIndex::QModelIndex((QModelIndex *)0x519ef6);
      QAbstractItemModel::beginInsertColumns(in_RDI,(int)local_20,0);
      *(undefined4 *)(in_RDI + 0x10) = 1;
      QAbstractItemModel::endInsertColumns();
    }
    internalUpdate(in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarModel::setWeekNumbersShown(bool show)
{
    if (m_weekNumbersShown == show)
        return;

    m_weekNumbersShown = show;
    if (show) {
        beginInsertColumns(QModelIndex(), 0, 0);
        m_firstColumn = 1;
        endInsertColumns();
    } else {
        beginRemoveColumns(QModelIndex(), 0, 0);
        m_firstColumn = 0;
        endRemoveColumns();
    }
    internalUpdate();
}